

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
argument_loader<kratos::InterfaceDefinition*,std::__cxx11::string_const&,unsigned_int,unsigned_int,kratos::PortDirection>
::load_impl_sequence<0ul,1ul,2ul,3ul,4ul>
          (argument_loader<kratos::InterfaceDefinition*,std::__cxx11::string_const&,unsigned_int,unsigned_int,kratos::PortDirection>
           *this,long call)

{
  bool bVar1;
  type_caster_generic *ptVar2;
  reference pvVar3;
  __tuple_element_t<1UL,_tuple<type_caster<InterfaceDefinition,_void>,_type_caster<basic_string<char>,_void>,_type_caster<unsigned_int,_void>,_type_caster<unsigned_int,_void>,_type_caster<PortDirection,_void>_>_>
  *this_00;
  __tuple_element_t<2UL,_tuple<type_caster<InterfaceDefinition,_void>,_type_caster<basic_string<char>,_void>,_type_caster<unsigned_int,_void>,_type_caster<unsigned_int,_void>,_type_caster<PortDirection,_void>_>_>
  *this_01;
  __tuple_element_t<3UL,_tuple<type_caster<InterfaceDefinition,_void>,_type_caster<basic_string<char>,_void>,_type_caster<unsigned_int,_void>,_type_caster<unsigned_int,_void>,_type_caster<PortDirection,_void>_>_>
  *this_02;
  byte local_99;
  reference local_98;
  handle local_88;
  reference local_80;
  handle local_70;
  reference local_68;
  handle local_58;
  reference local_50;
  handle local_40;
  reference local_38;
  handle local_28;
  long local_20;
  function_call *call_local;
  argument_loader<kratos::InterfaceDefinition_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_unsigned_int,_kratos::PortDirection>
  *this_local;
  
  local_20 = call;
  call_local = (function_call *)this;
  ptVar2 = (type_caster_generic *)
           std::
           get<0ul,pybind11::detail::type_caster<kratos::InterfaceDefinition,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<unsigned_int,void>,pybind11::detail::type_caster<unsigned_int,void>,pybind11::detail::type_caster<kratos::PortDirection,void>>
                     ((tuple<pybind11::detail::type_caster<kratos::InterfaceDefinition,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<unsigned_int,_void>,_pybind11::detail::type_caster<unsigned_int,_void>,_pybind11::detail::type_caster<kratos::PortDirection,_void>_>
                       *)this);
  pvVar3 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_20 + 8),
                      0);
  local_28.m_ptr = pvVar3->m_ptr;
  local_38 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),0);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_38);
  bVar1 = type_caster_generic::load(ptVar2,local_28,bVar1);
  local_99 = 1;
  if (bVar1) {
    this_00 = std::
              get<1ul,pybind11::detail::type_caster<kratos::InterfaceDefinition,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<unsigned_int,void>,pybind11::detail::type_caster<unsigned_int,void>,pybind11::detail::type_caster<kratos::PortDirection,void>>
                        ((tuple<pybind11::detail::type_caster<kratos::InterfaceDefinition,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<unsigned_int,_void>,_pybind11::detail::type_caster<unsigned_int,_void>,_pybind11::detail::type_caster<kratos::PortDirection,_void>_>
                          *)this);
    pvVar3 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                       ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                        (local_20 + 8),1);
    local_40.m_ptr = pvVar3->m_ptr;
    local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),1);
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_50);
    bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ::load(&this_00->
                    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ,local_40,bVar1);
    local_99 = 1;
    if (bVar1) {
      this_01 = std::
                get<2ul,pybind11::detail::type_caster<kratos::InterfaceDefinition,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<unsigned_int,void>,pybind11::detail::type_caster<unsigned_int,void>,pybind11::detail::type_caster<kratos::PortDirection,void>>
                          ((tuple<pybind11::detail::type_caster<kratos::InterfaceDefinition,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<unsigned_int,_void>,_pybind11::detail::type_caster<unsigned_int,_void>,_pybind11::detail::type_caster<kratos::PortDirection,_void>_>
                            *)this);
      pvVar3 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                         ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                          (local_20 + 8),2);
      local_58.m_ptr = pvVar3->m_ptr;
      local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),2);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_68);
      bVar1 = type_caster<unsigned_int,_void>::load(this_01,local_58,bVar1);
      local_99 = 1;
      if (bVar1) {
        this_02 = std::
                  get<3ul,pybind11::detail::type_caster<kratos::InterfaceDefinition,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<unsigned_int,void>,pybind11::detail::type_caster<unsigned_int,void>,pybind11::detail::type_caster<kratos::PortDirection,void>>
                            ((tuple<pybind11::detail::type_caster<kratos::InterfaceDefinition,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<unsigned_int,_void>,_pybind11::detail::type_caster<unsigned_int,_void>,_pybind11::detail::type_caster<kratos::PortDirection,_void>_>
                              *)this);
        pvVar3 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                           ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                            (local_20 + 8),3);
        local_70.m_ptr = pvVar3->m_ptr;
        local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),3);
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_80);
        bVar1 = type_caster<unsigned_int,_void>::load(this_02,local_70,bVar1);
        local_99 = 1;
        if (bVar1) {
          ptVar2 = (type_caster_generic *)
                   std::
                   get<4ul,pybind11::detail::type_caster<kratos::InterfaceDefinition,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<unsigned_int,void>,pybind11::detail::type_caster<unsigned_int,void>,pybind11::detail::type_caster<kratos::PortDirection,void>>
                             ((tuple<pybind11::detail::type_caster<kratos::InterfaceDefinition,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<unsigned_int,_void>,_pybind11::detail::type_caster<unsigned_int,_void>,_pybind11::detail::type_caster<kratos::PortDirection,_void>_>
                               *)this);
          pvVar3 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                             ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                              (local_20 + 8),4);
          local_88.m_ptr = pvVar3->m_ptr;
          local_98 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),4);
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_98);
          bVar1 = type_caster_generic::load(ptVar2,local_88,bVar1);
          local_99 = bVar1 ^ 0xff;
        }
      }
    }
  }
  return (local_99 & 1) == 0;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }